

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplydataimpl.cpp
# Opt level: O0

void __thiscall
QNetworkReplyDataImpl::QNetworkReplyDataImpl
          (QNetworkReplyDataImpl *this,QObject *parent,QNetworkRequest *req,Operation op)

{
  QNetworkReplyPrivate *dd;
  QNetworkReplyDataImplPrivate *arguments_1;
  ulong uVar1;
  undefined4 in_ECX;
  QObject *in_RDX;
  char *in_RSI;
  QMetaMethodArgument *in_RDI;
  long in_FS_OFFSET;
  QNetworkReplyDataImplPrivate *d;
  QString msg;
  QHttpHeaders h;
  qint64 size;
  QByteArray payload;
  QString mimeType;
  QUrl url;
  undefined4 in_stack_fffffffffffffe78;
  Operation in_stack_fffffffffffffe7c;
  QNetworkReplyDataImplPrivate *in_stack_fffffffffffffe80;
  QBuffer *this_00;
  ConnectionType CVar2;
  undefined4 in_stack_fffffffffffffea0;
  ConnectionType c;
  QMetaMethodArgument *obj;
  QChar in_stack_fffffffffffffece;
  QAnyStringView in_stack_fffffffffffffee0;
  char local_100 [24];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined1 local_98 [56];
  undefined8 local_60;
  qsizetype local_58;
  QByteArray local_50;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  QUrl local_20 [2];
  QUrl local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  obj = in_RDI;
  dd = (QNetworkReplyPrivate *)operator_new(0x240);
  QNetworkReplyDataImplPrivate::QNetworkReplyDataImplPrivate(in_stack_fffffffffffffe80);
  QNetworkReply::QNetworkReply((QNetworkReply *)in_RDI,dd,(QObject *)in_stack_fffffffffffffe80);
  ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)&in_RDI->metaType)->m_data =
       &PTR_metaObject_0049ad18;
  arguments_1 = d_func((QNetworkReplyDataImpl *)0x1e4fac);
  QNetworkReply::setRequest
            ((QNetworkReply *)in_stack_fffffffffffffe80,
             (QNetworkRequest *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  QNetworkRequest::url((QNetworkRequest *)dd);
  QNetworkReply::setUrl
            ((QNetworkReply *)in_stack_fffffffffffffe80,
             (QUrl *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  QUrl::~QUrl(&local_10);
  QNetworkReply::setOperation((QNetworkReply *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
  QNetworkReply::setFinished
            ((QNetworkReply *)in_stack_fffffffffffffe80,SUB41(in_stack_fffffffffffffe7c >> 0x18,0));
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe7c);
  QIODevice::open((QFlags_conflict *)in_RDI);
  local_20[0].d = (QUrlPrivate *)0xaaaaaaaaaaaaaaaa;
  QNetworkRequest::url((QNetworkRequest *)dd);
  local_38 = 0xaaaaaaaaaaaaaaaa;
  local_30 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x1e508c);
  local_50.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_50.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_50.d.size = -0x5555555555555556;
  QByteArray::QByteArray((QByteArray *)0x1e50c6);
  uVar1 = qDecodeDataUrl((QUrl *)local_20,(QString *)&local_38,&local_50);
  if ((uVar1 & 1) == 0) {
    local_e8 = 0xaaaaaaaaaaaaaaaa;
    local_e0 = 0xaaaaaaaaaaaaaaaa;
    local_d8 = 0xaaaaaaaaaaaaaaaa;
    QCoreApplication::translate(local_100,"QNetworkAccessDataBackend","Invalid URI: %1",0);
    QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
              ((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> *)
               &stack0xfffffffffffffee4,PrettyDecoded);
    QUrl::toString((QUrlTwoFlags_conflict1 *)&stack0xfffffffffffffee8);
    QChar::QChar<char16_t,_true>((QChar *)&stack0xfffffffffffffee2,L' ');
    QString::arg<QString,_true>
              ((QString *)CONCAT44(in_ECX,in_stack_fffffffffffffea0),(QString *)arguments_1,
               (int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffece);
    QString::~QString((QString *)0x1e5376);
    QString::~QString((QString *)0x1e5383);
    QNetworkReply::setError
              ((QNetworkReply *)in_RDI,(NetworkError)((ulong)dd >> 0x20),
               (QString *)in_stack_fffffffffffffe80);
    QtPrivate::Invoke::argument<QNetworkReply::NetworkError>((char *)in_RDI,(NetworkError *)dd);
    CVar2 = (ConnectionType)((ulong)dd >> 0x20);
    QMetaObject::invokeMethod<QMetaMethodArgument>
              (in_RDX,(char *)CONCAT44(in_ECX,in_stack_fffffffffffffea0),
               (ConnectionType)((ulong)arguments_1 >> 0x20),in_RDI);
    QMetaObject::invokeMethod<>((QObject *)arguments_1,(char *)in_RDI,CVar2);
    QString::~QString((QString *)0x1e53f6);
  }
  else {
    local_58 = QByteArray::size(&local_50);
    c = (ConnectionType)((ulong)in_RDX >> 0x20);
    local_60 = 0xaaaaaaaaaaaaaaaa;
    QNetworkReply::headers((QNetworkReply *)dd);
    QAnyStringView::QAnyStringView((QAnyStringView *)in_RDI,(QString *)dd);
    QHttpHeaders::replaceOrAppend
              ((QHttpHeaders *)dd,(WellKnownHeader)((ulong)in_stack_fffffffffffffe80 >> 0x20),
               in_stack_fffffffffffffee0);
    QByteArray::number((longlong)local_98,(int)local_58);
    QAnyStringView::QAnyStringView((QAnyStringView *)in_RDI,(QByteArray *)dd);
    QHttpHeaders::replaceOrAppend
              ((QHttpHeaders *)dd,(WellKnownHeader)((ulong)in_stack_fffffffffffffe80 >> 0x20),
               in_stack_fffffffffffffee0);
    QByteArray::~QByteArray((QByteArray *)0x1e51b7);
    QNetworkReply::setHeaders
              ((QNetworkReply *)in_stack_fffffffffffffe80,
               (QHttpHeaders *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    QMetaObject::invokeMethod<>
              ((QObject *)arguments_1,(char *)in_RDI,(ConnectionType)((ulong)dd >> 0x20));
    QBuffer::setData((QByteArray *)&arguments_1->decodedData);
    this_00 = &arguments_1->decodedData;
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)this_00,in_stack_fffffffffffffe7c);
    QBuffer::open((QFlags_conflict *)this_00);
    QtPrivate::Invoke::argument<long_long>((char *)in_RDI,(longlong *)dd);
    QtPrivate::Invoke::argument<long_long>((char *)in_RDI,(longlong *)dd);
    CVar2 = (ConnectionType)((ulong)dd >> 0x20);
    QMetaObject::invokeMethod<QMetaMethodArgument,QMetaMethodArgument>
              ((QObject *)obj,in_RSI,c,
               (QMetaMethodArgument *)CONCAT44(in_ECX,in_stack_fffffffffffffea0),
               (QMetaMethodArgument *)arguments_1);
    QMetaObject::invokeMethod<>((QObject *)arguments_1,(char *)in_RDI,CVar2);
    QMetaObject::invokeMethod<>((QObject *)arguments_1,(char *)in_RDI,CVar2);
    QHttpHeaders::~QHttpHeaders((QHttpHeaders *)0x1e52c2);
  }
  QByteArray::~QByteArray((QByteArray *)0x1e5403);
  QString::~QString((QString *)0x1e5410);
  QUrl::~QUrl(local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReplyDataImpl::QNetworkReplyDataImpl(QObject *parent, const QNetworkRequest &req, const QNetworkAccessManager::Operation op)
    : QNetworkReply(*new QNetworkReplyDataImplPrivate(), parent)
{
    Q_D(QNetworkReplyDataImpl);
    setRequest(req);
    setUrl(req.url());
    setOperation(op);
    setFinished(true);
    QNetworkReply::open(QIODevice::ReadOnly);

    QUrl url = req.url();
    QString mimeType;
    QByteArray payload;
    if (qDecodeDataUrl(url, mimeType, payload)) {
        qint64 size = payload.size();
        auto h = headers();
        h.replaceOrAppend(QHttpHeaders::WellKnownHeader::ContentType, mimeType);
        h.replaceOrAppend(QHttpHeaders::WellKnownHeader::ContentLength, QByteArray::number(size));
        setHeaders(std::move(h));

        QMetaObject::invokeMethod(this, "metaDataChanged", Qt::QueuedConnection);

        d->decodedData.setData(payload);
        d->decodedData.open(QIODevice::ReadOnly);

        QMetaObject::invokeMethod(this, "downloadProgress", Qt::QueuedConnection,
                                  Q_ARG(qint64,size), Q_ARG(qint64, size));
        QMetaObject::invokeMethod(this, "readyRead", Qt::QueuedConnection);
        QMetaObject::invokeMethod(this, "finished", Qt::QueuedConnection);
    } else {
        // something wrong with this URI
        const QString msg = QCoreApplication::translate("QNetworkAccessDataBackend",
                                                        "Invalid URI: %1").arg(url.toString());
        setError(QNetworkReply::ProtocolFailure, msg);
        QMetaObject::invokeMethod(this, "errorOccurred", Qt::QueuedConnection,
                                  Q_ARG(QNetworkReply::NetworkError, QNetworkReply::ProtocolFailure));
        QMetaObject::invokeMethod(this, "finished", Qt::QueuedConnection);
    }
}